

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCGeometry.cpp
# Opt level: O2

bool Assimp::IFC::ProcessPolyloop(IfcPolyLoop *loop,TempMesh *meshout,ConversionData *param_3)

{
  pointer *ppaVar1;
  uint uVar2;
  Lazy *pLVar3;
  pointer puVar4;
  IfcCartesianPoint *in;
  int iVar5;
  Lazy *this;
  IfcVector3 tmp;
  IfcVector3 local_48;
  
  pLVar3 = *(Lazy **)&loop->field_0x48;
  iVar5 = 0;
  for (this = *(Lazy **)&(loop->super_IfcLoop).field_0x40; this != pLVar3; this = this + 8) {
    in = STEP::Lazy::operator_cast_to_IfcCartesianPoint_(this);
    local_48.x = 0.0;
    local_48.y = 0.0;
    local_48.z = 0.0;
    ConvertCartesianPoint(&local_48,in);
    std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
              (&meshout->mVerts,&local_48);
    iVar5 = iVar5 + 1;
  }
  local_48.x = (double)CONCAT44(local_48.x._4_4_,iVar5);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&meshout->mVertcnt,(uint *)&local_48);
  puVar4 = (meshout->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar2 = puVar4[-1];
  if (uVar2 == 1) {
    (meshout->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar4 + -1;
    ppaVar1 = &(meshout->mVerts).
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppaVar1 = *ppaVar1 + -1;
  }
  return 1 < uVar2;
}

Assistant:

bool ProcessPolyloop(const Schema_2x3::IfcPolyLoop& loop, TempMesh& meshout, ConversionData& /*conv*/)
{
    size_t cnt = 0;
    for(const Schema_2x3::IfcCartesianPoint& c : loop.Polygon) {
        IfcVector3 tmp;
        ConvertCartesianPoint(tmp,c);

        meshout.mVerts.push_back(tmp);
        ++cnt;
    }

    meshout.mVertcnt.push_back(static_cast<unsigned int>(cnt));

    // zero- or one- vertex polyloops simply ignored
    if (meshout.mVertcnt.back() > 1) {
        return true;
    }

    if (meshout.mVertcnt.back()==1) {
        meshout.mVertcnt.pop_back();
        meshout.mVerts.pop_back();
    }
    return false;
}